

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O0

int shake256_squeeze(keccak_sponge *sponge,uint8_t *out,size_t outlen)

{
  keccak_sponge *in_RDX;
  long in_RSI;
  size_t in_RDI;
  keccak_sponge *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = -1;
  }
  else if (in_RSI == 0) {
    iVar1 = -1;
  }
  else if (in_RDX < (keccak_sponge *)0x8000000000000000) {
    if (*(ulong *)(in_RDI + 0xd8) < 0x88) {
      if (*(long *)(in_RDI + 0xd0) != 0x44a50aed67ba8c04) {
        if (*(long *)(in_RDI + 0xd0) != 0x53efb6b64647b401) {
          return 2;
        }
        _shake_pad(in_RDX);
        *(undefined8 *)(in_RDI + 0xd0) = 0x44a50aed67ba8c04;
      }
      _sponge_squeeze(unaff_retaddr,
                      (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI);
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int shake256_squeeze(keccak_sponge* const __restrict sponge,
                     uint8_t* const __restrict out,
                     const size_t outlen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (out == NULL) {
    return SPONGERR_NULL;
  }
  if (outlen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }

  switch (sponge->flags) {
    case (FLAG_SQUEEZING):
      break;
    case (FLAG_ABSORBING):
      // If we're still absorbing, pad the message and apply Keccak-f.
      _shake_pad(sponge);
      sponge->flags = FLAG_SQUEEZING;
      break;
    default:
      // The sponge hasn't been initialized.
      return SPONGERR_NOTINIT;
  }

  _sponge_squeeze(sponge, out, outlen);

  return 0;
}